

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

SegmentAnd<capnp::word_*>
capnp::_::WireHelpers::setStructPointer
          (SegmentBuilder *segment,CapTableBuilder *capTable,WirePointer *ref,StructReader value,
          BuilderArena *orphanArena,bool canonical)

{
  BuilderArena *this;
  word *pwVar1;
  ulong uVar2;
  uint uVar3;
  WirePointer *pWVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  SegmentWordCount amount;
  undefined7 in_register_00000081;
  word *srcTarget;
  uint uVar8;
  long lVar9;
  uint uVar10;
  AllocateResult AVar12;
  SegmentAnd<capnp::word_*> SVar13;
  WirePointer *local_60;
  anon_class_1_0_00000001 local_55;
  int local_54;
  ulong local_50;
  ulong local_48;
  CapTableBuilder *local_40;
  Fault f;
  ulong uVar11;
  
  iVar7 = (int)CONCAT71(in_register_00000081,canonical);
  uVar10 = value.dataSize + 7 >> 3;
  uVar11 = (ulong)uVar10;
  uVar8 = (uint)value.pointerCount;
  local_40 = capTable;
  if (iVar7 != 0) {
    if (((undefined1  [48])value & (undefined1  [48])0x7) != (undefined1  [48])0x0 &&
        value.dataSize != 1) {
      kj::_::Debug::Fault::Fault
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x6d5,FAILED,
                 "(value.dataSize == ONE * BITS) || (value.dataSize % BITS_PER_BYTE == ZERO * BITS)"
                 ,"");
      kj::_::Debug::Fault::fatal(&f);
    }
    if (value.dataSize == 1) {
      if ((*value.data & 1) == 0) {
        uVar11 = 0;
      }
    }
    else {
      uVar2 = (ulong)(value.dataSize >> 3);
      do {
        uVar11 = uVar2;
        if ((void *)(uVar11 + (long)value.data) <= value.data) break;
        uVar2 = uVar11 - 1;
      } while (*(char *)((long)value.data + (uVar11 - 1)) == '\0');
    }
    uVar10 = (uint)uVar11;
    lVar9 = (ulong)value.pointerCount << 3;
    do {
      lVar5 = lVar9;
      pWVar4 = (WirePointer *)((long)&((value.pointers)->offsetAndKind).value + lVar5);
      if (pWVar4 <= value.pointers) break;
      lVar9 = lVar5 + -8;
    } while (pWVar4[-1].field_1.upper32Bits == 0 && pWVar4[-1].offsetAndKind.value == 0);
    uVar8 = (uint)lVar5 >> 3;
  }
  uVar3 = uVar10 + 7 >> 3;
  local_48 = (ulong)uVar3;
  local_50 = (ulong)(uVar8 & 0xffff);
  amount = uVar3 + (uVar8 & 0xffff);
  if (orphanArena == (BuilderArena *)0x0) {
    local_54 = iVar7;
    if ((ref->field_1).upper32Bits != 0 || (ref->offsetAndKind).value != 0) {
      zeroObject(segment,capTable,ref);
      canonical = SUB41(local_54,0);
    }
    if (amount == 0) {
      (ref->offsetAndKind).value = 0xfffffffc;
      local_60 = ref;
    }
    else {
      local_60 = (WirePointer *)segment->pos;
      if (((long)((long)(segment->super_SegmentReader).ptr.ptr +
                 ((segment->super_SegmentReader).ptr.size_ * 8 - (long)local_60)) >> 3 <
           (long)(ulong)amount) ||
         (segment->pos = (word *)(local_60 + amount), local_60 == (WirePointer *)0x0)) {
        this = (BuilderArena *)(segment->super_SegmentReader).arena;
        uVar3 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::allocate(capnp::_::WirePointer*&,capnp::_::SegmentBuilder*&,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::WirePointer::Kind,capnp::_::BuilderArena*)::_lambda()_1_>
                          (amount + 1,&local_55);
        AVar12 = BuilderArena::allocate(this,uVar3);
        pWVar4 = (WirePointer *)AVar12.words;
        segment = AVar12.segment;
        (ref->offsetAndKind).value =
             (int)AVar12.words - *(int *)&(segment->super_SegmentReader).ptr.ptr & 0xfffffff8U | 2;
        ref->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)
                       (segment->super_SegmentReader).id.value;
        canonical = SUB41(local_54,0);
        (pWVar4->offsetAndKind).value = 0;
        local_60 = pWVar4 + 1;
        ref = pWVar4;
      }
      else {
        (ref->offsetAndKind).value =
             ((uint)((ulong)((long)local_60 - (long)ref) >> 1) & 0xfffffffc) - 4;
      }
    }
  }
  else {
    AVar12 = BuilderArena::allocate(orphanArena,amount);
    local_60 = (WirePointer *)AVar12.words;
    segment = AVar12.segment;
    (ref->offsetAndKind).value = 0xfffffffc;
  }
  (ref->field_1).structRef.dataSize.value = (unsigned_short)local_48;
  (ref->field_1).structRef.ptrCount.value = (unsigned_short)uVar8;
  if (value.dataSize == 1) {
    if (uVar10 != 0) {
      *(byte *)&(local_60->offsetAndKind).value = *value.data & 1;
    }
  }
  else if (uVar10 != 0) {
    memcpy(local_60,value.data,(ulong)uVar10);
  }
  pWVar4 = local_60 + (local_48 & 0xffffffff);
  local_50 = (ulong)(uint)((int)local_50 << 3);
  lVar9 = 8;
  for (lVar5 = -8; local_50 + lVar5 != -8; lVar5 = lVar5 + -8) {
    lVar6 = (long)(*(int *)((long)&value.pointers[-1].offsetAndKind.value + lVar9) >> 2);
    if (value.segment == (SegmentReader *)0x0) {
      srcTarget = (word *)((long)&value.pointers[lVar6].offsetAndKind.value + lVar9);
    }
    else {
      pwVar1 = ((value.segment)->ptr).ptr;
      srcTarget = pwVar1 + ((value.segment)->ptr).size_;
      if (((long)pwVar1 + (lVar5 - (long)value.pointers) >> 3 <= lVar6) &&
         (lVar6 <= (long)srcTarget + (lVar5 - (long)value.pointers) >> 3)) {
        srcTarget = (word *)((long)&value.pointers[lVar6].offsetAndKind.value + lVar9);
      }
    }
    copyPointer(segment,local_40,pWVar4,value.segment,value.capTable,
                (WirePointer *)((long)&value.pointers[-1].offsetAndKind.value + lVar9),srcTarget,
                value.nestingLimit,(BuilderArena *)0x0,canonical);
    pWVar4 = pWVar4 + 1;
    lVar9 = lVar9 + 8;
  }
  SVar13.value = (word *)local_60;
  SVar13.segment = segment;
  return SVar13;
}

Assistant:

static SegmentAnd<word*> setStructPointer(
      SegmentBuilder* segment, CapTableBuilder* capTable, WirePointer* ref, StructReader value,
      BuilderArena* orphanArena = nullptr, bool canonical = false) {
    auto dataSize = roundBitsUpToBytes(value.dataSize);
    auto ptrCount = value.pointerCount;

    if (canonical) {
      // StructReaders should not have bitwidths other than 1, but let's be safe
      KJ_REQUIRE((value.dataSize == ONE * BITS)
                 || (value.dataSize % BITS_PER_BYTE == ZERO * BITS));

      if (value.dataSize == ONE * BITS) {
        // Handle the truncation case where it's a false in a 1-bit struct
        if (!value.getDataField<bool>(ZERO * ELEMENTS)) {
          dataSize = ZERO * BYTES;
        }
      } else {
        // Truncate the data section
        auto data = value.getDataSectionAsBlob();
        auto end = data.end();
        while (end > data.begin() && end[-1] == 0) --end;
        dataSize = intervalLength(data.begin(), end, MAX_STUCT_DATA_WORDS * BYTES_PER_WORD);
      }

      // Truncate pointer section
      const WirePointer* ptr = value.pointers + ptrCount;
      while (ptr > value.pointers && ptr[-1].isNull()) --ptr;
      ptrCount = intervalLength(value.pointers, ptr, MAX_STRUCT_POINTER_COUNT);
    }

    auto dataWords = roundBytesUpToWords(dataSize);

    auto totalSize = dataWords + ptrCount * WORDS_PER_POINTER;

    word* ptr = allocate(ref, segment, capTable, totalSize, WirePointer::STRUCT, orphanArena);
    ref->structRef.set(dataWords, ptrCount);

    if (value.dataSize == ONE * BITS) {
      // Data size could be made 0 by truncation
      if (dataSize != ZERO * BYTES) {
        *reinterpret_cast<char*>(ptr) = value.getDataField<bool>(ZERO * ELEMENTS);
      }
    } else {
      copyMemory(reinterpret_cast<byte*>(ptr),
                 reinterpret_cast<const byte*>(value.data),
                 dataSize);
    }

    WirePointer* pointerSection = reinterpret_cast<WirePointer*>(ptr + dataWords);
    for (auto i: kj::zeroTo(ptrCount)) {
      copyPointer(segment, capTable, pointerSection + i,
                  value.segment, value.capTable, value.pointers + i,
                  value.nestingLimit, nullptr, canonical);
    }

    return { segment, ptr };
  }